

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_debug_prefix_nal_unit_svc(nal_t *nal,bs_t *b)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  _Bool _Var5;
  
  if (nal->nal_ref_idc == 0) {
    iVar2 = more_rbsp_data(b);
    while (iVar2 != 0) {
      pFVar4 = (FILE *)h264_dbgfile;
      if ((FILE *)h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      _Var5 = false;
      fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar3 = b->bits_left - 1;
      b->bits_left = uVar3;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        _Var5 = (*pbVar1 >> (uVar3 & 0x1f) & 1) != 0;
      }
      if (uVar3 == 0) {
        b->p = pbVar1 + 1;
        b->bits_left = 8;
      }
      nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = _Var5;
      pFVar4 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar4 = _stdout;
      }
      fprintf(pFVar4,"nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n",
              (ulong)_Var5);
      iVar2 = more_rbsp_data(b);
    }
  }
  else {
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    _Var5 = false;
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      _Var5 = (*pbVar1 >> (uVar3 & 0x1f) & 1) != 0;
    }
    if (uVar3 == 0) {
      b->p = pbVar1 + 1;
      b->bits_left = 8;
    }
    nal->prefix_nal_svc->store_ref_base_pic_flag = _Var5;
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"nal->prefix_nal_svc->store_ref_base_pic_flag: %d \n",(ulong)_Var5);
    if (((nal->nal_svc_ext->use_ref_base_pic_flag != false) ||
        (nal->prefix_nal_svc->store_ref_base_pic_flag == true)) &&
       (nal->nal_svc_ext->idr_flag == false)) {
      read_debug_dec_ref_base_pic_marking(nal,b);
    }
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    _Var5 = false;
    fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      _Var5 = (*pbVar1 >> (uVar3 & 0x1f) & 1) != 0;
    }
    if (uVar3 == 0) {
      b->p = pbVar1 + 1;
      b->bits_left = 8;
    }
    nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag = _Var5;
    pFVar4 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar4 = _stdout;
    }
    fprintf(pFVar4,"nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag: %d \n",
            (ulong)_Var5);
    if (nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag == true) {
      iVar2 = more_rbsp_data(b);
      while (iVar2 != 0) {
        pFVar4 = (FILE *)h264_dbgfile;
        if ((FILE *)h264_dbgfile == (FILE *)0x0) {
          pFVar4 = _stdout;
        }
        _Var5 = false;
        fprintf(pFVar4,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar3 = b->bits_left - 1;
        b->bits_left = uVar3;
        pbVar1 = b->p;
        if (pbVar1 < b->end) {
          _Var5 = (*pbVar1 >> (uVar3 & 0x1f) & 1) != 0;
        }
        if (uVar3 == 0) {
          b->p = pbVar1 + 1;
          b->bits_left = 8;
        }
        nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = _Var5;
        pFVar4 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar4 = _stdout;
        }
        fprintf(pFVar4,"nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n",
                (ulong)_Var5);
        iVar2 = more_rbsp_data(b);
      }
    }
  }
  return;
}

Assistant:

void read_debug_prefix_nal_unit_svc(nal_t* nal, bs_t* b)
{
    if( nal->nal_ref_idc != 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->store_ref_base_pic_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->store_ref_base_pic_flag: %d \n", nal->prefix_nal_svc->store_ref_base_pic_flag); 
        if( ( nal->nal_svc_ext->use_ref_base_pic_flag || nal->prefix_nal_svc->store_ref_base_pic_flag ) &&
             !nal->nal_svc_ext->idr_flag )
        {
            read_debug_dec_ref_base_pic_marking( nal, b );
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag); 
        if( nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag )
        {
            while( more_rbsp_data( b ) )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag); 
            }
        }
    }
    else if( more_rbsp_data( b ) )
    {
        while( more_rbsp_data( b ) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag); 
        }
    }
}